

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

void __thiscall particleSamples::filter_particles_from_events(particleSamples *this,int PoI_monval)

{
  int PoI_monval_00;
  
  filter_particles(this,PoI_monval,this->full_particle_list,this->particle_list);
  if (this->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
    if (PoI_monval == 0xc32) {
      PoI_monval_00 = 0xc8c;
    }
    else {
      if (PoI_monval != -0xc32) goto LAB_001171aa;
      PoI_monval_00 = -0xc8c;
    }
    filter_particles(this,PoI_monval_00,this->full_particle_list,this->resonance_list_Sigma0);
  }
LAB_001171aa:
  if (this->net_particle_flag == 1) {
    filter_particles(this,-PoI_monval,this->full_particle_list,this->anti_particle_list);
  }
  if ((PoI_monval == 0x14d) && (this->reconst_flag == 1)) {
    filter_particles(this,0x141,this->full_particle_list,this->reconst_list_1);
    filter_particles(this,-0x141,this->full_particle_list,this->reconst_list_2);
    perform_particle_reconstruction(this);
  }
  else if ((PoI_monval == 9999) && (this->flag_charge_dependence == 1)) {
    filter_particles(this,0x270e,this->full_particle_list,this->positive_charge_hadron_list);
    filter_particles(this,-0x270e,this->full_particle_list,this->negative_charge_hadron_list);
  }
  if (this->analyze_BF == true) {
    filter_particles(this,this->particle_monval_a,this->full_particle_list,
                     this->balance_function_particle_a);
    filter_particles(this,this->particle_monval_abar,this->full_particle_list,
                     this->balance_function_particle_abar);
    filter_particles(this,this->particle_monval_b,this->full_particle_list,
                     this->balance_function_particle_b);
    filter_particles(this,this->particle_monval_bbar,this->full_particle_list,
                     this->balance_function_particle_bbar);
    return;
  }
  return;
}

Assistant:

void particleSamples::filter_particles_from_events(const int PoI_monval) {
    filter_particles(PoI_monval, full_particle_list, particle_list);

    if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
        if (PoI_monval == 3122) {
            filter_particles(3212, full_particle_list, resonance_list_Sigma0);
        } else if (PoI_monval == -3122) {
            filter_particles(-3212, full_particle_list, resonance_list_Sigma0);
        }
    }

    if (net_particle_flag == 1) {
        filter_particles(-PoI_monval, full_particle_list, anti_particle_list);
    }

    if (reconst_flag == 1 && PoI_monval == 333) {
        filter_particles(321, full_particle_list, reconst_list_1);
        filter_particles(-321, full_particle_list, reconst_list_2);
        perform_particle_reconstruction();
    }

    if (flag_charge_dependence == 1 && PoI_monval == 9999) {
        filter_particles(9998, full_particle_list, positive_charge_hadron_list);
        filter_particles(
            -9998, full_particle_list, negative_charge_hadron_list);
    }

    if (analyze_BF) {
        filter_particles(
            particle_monval_a, full_particle_list, balance_function_particle_a);
        filter_particles(
            particle_monval_abar, full_particle_list,
            balance_function_particle_abar);
        filter_particles(
            particle_monval_b, full_particle_list, balance_function_particle_b);
        filter_particles(
            particle_monval_bbar, full_particle_list,
            balance_function_particle_bbar);
    }
}